

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# printer_yang.c
# Opt level: O0

void yang_print_rpc_action(lyout *out,int level,lys_node *node)

{
  char *pcVar1;
  lys_node_rpc_action *rpc;
  lys_node *sub;
  int flag;
  int i;
  lys_node *node_local;
  lyout *plStack_10;
  int level_local;
  lyout *out_local;
  
  sub._0_4_ = 0;
  pcVar1 = "action";
  if (node->nodetype == LYS_RPC) {
    pcVar1 = "rpc";
  }
  _flag = node;
  node_local._4_4_ = level;
  plStack_10 = out;
  ly_print(out,"%*s%s %s",(ulong)(uint)(level << 1),"",pcVar1,node->name);
  node_local._4_4_ = node_local._4_4_ + 1;
  yang_print_snode_common(plStack_10,node_local._4_4_,_flag,_flag->module,(int *)&sub,0x73);
  for (sub._4_4_ = 0; sub._4_4_ < (int)(uint)*(ushort *)(node->padding + 2);
      sub._4_4_ = sub._4_4_ + 1) {
    yang_print_open(plStack_10,(int *)&sub);
    yang_print_typedef(plStack_10,node_local._4_4_,_flag->module,
                       (lys_tpdf *)(node[1].name + (long)sub._4_4_ * 0x80));
  }
  for (rpc = (lys_node_rpc_action *)_flag->child; rpc != (lys_node_rpc_action *)0x0;
      rpc = (lys_node_rpc_action *)rpc->next) {
    if ((rpc->parent == _flag) &&
       (((rpc->nodetype & (LYS_OUTPUT|LYS_INPUT)) == LYS_UNKNOWN || ((rpc->flags & 0x40) == 0)))) {
      yang_print_open(plStack_10,(int *)&sub);
      yang_print_snode(plStack_10,node_local._4_4_,(lys_node *)rpc,0xe00);
    }
  }
  node_local._4_4_ = node_local._4_4_ + -1;
  yang_print_close(plStack_10,node_local._4_4_,(int)sub);
  return;
}

Assistant:

static void
yang_print_rpc_action(struct lyout *out, int level, const struct lys_node *node)
{
    int i, flag = 0;
    struct lys_node *sub;
    struct lys_node_rpc_action *rpc = (struct lys_node_rpc_action *)node;

    ly_print(out, "%*s%s %s", LEVEL, INDENT, (node->nodetype == LYS_RPC ? "rpc" : "action"), node->name);

    level++;
    yang_print_snode_common(out, level, node, node->module, &flag, SNODE_COMMON_EXT | SNODE_COMMON_IFF |
                            SNODE_COMMON_STATUS | SNODE_COMMON_DSC | SNODE_COMMON_REF);

    for (i = 0; i < rpc->tpdf_size; i++) {
        yang_print_open(out, &flag);
        yang_print_typedef(out, level, node->module, &rpc->tpdf[i]);
    }

    LY_TREE_FOR(node->child, sub) {
        /* augments and implicit nodes */
        if ((sub->parent != node) || ((sub->nodetype & (LYS_INPUT | LYS_OUTPUT) && (sub->flags & LYS_IMPLICIT)))) {
            continue;
        }
        yang_print_open(out, &flag);
        yang_print_snode(out, level, sub, LYS_INPUT | LYS_OUTPUT | LYS_GROUPING);
    }

    level--;
    yang_print_close(out, level, flag);
}